

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

bool __thiscall
slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>::iterator::
overflow<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Compilation::NetAlias_const*,8u,false>>
          (iterator *this,uint32_t level,allocator_type *alloc)

{
  iterator *piVar1;
  unsigned_long *puVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  uintptr_t intWord;
  NodeRef NVar6;
  LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_false> *pLVar7;
  undefined7 extraout_var;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  undefined4 in_register_00000034;
  ulong uVar12;
  uint uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  uint32_t curSizes [4];
  uint32_t newSizes [4];
  LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_false> *nodes [4];
  interval<unsigned_long> ival;
  uint local_d8 [6];
  PointerIntPair<void_*,_6U,_6U,_unsigned_int> local_c0;
  iterator *local_b8;
  IndexPair local_b0;
  ulong local_a8;
  uint local_9c;
  uint32_t local_98 [6];
  ulong local_80;
  allocator_type *local_78;
  iterator *local_70;
  ulong local_68 [4];
  ulong local_48;
  interval<unsigned_long> local_40;
  
  local_80 = CONCAT44(in_register_00000034,level);
  piVar1 = this + 8;
  lVar18 = (ulong)level * 0x10;
  uVar14 = *(uint32_t *)(*(long *)(this + 8) + 0xc + lVar18);
  local_78 = alloc;
  local_70 = this;
  local_c0.value = (uintptr_t)IntervalMapDetails::Path::getLeftSibling((Path *)piVar1,level);
  if (local_c0.value == 0) {
    uVar9 = 0;
  }
  else {
    uVar8 = (uint)local_c0.value & 0x3f;
    uVar9 = uVar8 + 1;
    uVar14 = uVar14 + uVar8 + 1;
    local_68[0] = local_c0.value & 0xffffffffffffffc0;
    local_d8[0] = uVar9;
  }
  bVar4 = local_c0.value != 0;
  lVar10 = *(long *)piVar1;
  uVar8 = *(uint *)(lVar10 + 8 + lVar18);
  local_d8[bVar4] = uVar8;
  uVar15 = uVar9 + uVar8;
  uVar8 = bVar4 + 1;
  local_68[bVar4] = *(ulong *)(lVar10 + lVar18);
  NVar6 = IntervalMapDetails::Path::getRightSibling((Path *)piVar1,(uint32_t)local_80);
  uVar9 = uVar8;
  if (NVar6.pip.value != 0) {
    uVar9 = (uint)NVar6.pip.value & 0x3f;
    local_d8[uVar8] = uVar9 + 1;
    uVar15 = uVar15 + uVar9 + 1;
    uVar9 = bVar4 | 2;
    local_68[uVar8] = (ulong)NVar6.pip.value & 0xffffffffffffffc0;
  }
  local_a8 = 0;
  local_b8 = piVar1;
  if (uVar9 * 8 < uVar15 + 1) {
    uVar8 = uVar9 - 1;
    if (uVar9 == 1) {
      uVar8 = 1;
    }
    uVar19 = (ulong)uVar8;
    local_d8[uVar9] = local_d8[uVar19];
    local_68[uVar9] = local_68[uVar19];
    local_d8[uVar19] = 0;
    pLVar7 = PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Compilation::NetAlias_const*,8u,false>>
                       ((PoolAllocator<char,192ul,64ul> *)local_78);
    local_68[uVar19] = (ulong)pLVar7;
    uVar9 = uVar9 + 1;
    local_a8 = uVar19;
  }
  local_b0 = IntervalMapDetails::distribute(uVar9,uVar15,8,local_98,uVar14);
  uVar8 = uVar9 - 1;
  if (uVar8 != 0) {
    local_9c = uVar8;
    uVar19 = (ulong)uVar8;
    iVar11 = uVar9 - 2;
    local_48 = uVar19;
    do {
      uVar8 = local_d8[uVar19];
      uVar13 = local_98[uVar19];
      iVar3 = iVar11;
      if (uVar8 != uVar13) {
        do {
          if (iVar3 == -1) break;
          uVar14 = local_d8[iVar3];
          iVar5 = IntervalMapDetails::
                  NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Compilation::NetAlias_*,_8U>
                  ::adjustFromLeftSib((NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Compilation::NetAlias_*,_8U>
                                       *)local_68[uVar19],uVar8,
                                      (NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Compilation::NetAlias_*,_8U>
                                       *)local_68[iVar3],uVar14,uVar13 - uVar8);
          local_d8[iVar3] = uVar14 - iVar5;
          uVar8 = iVar5 + local_d8[uVar19];
          local_d8[uVar19] = uVar8;
          uVar13 = local_98[uVar19];
          iVar3 = iVar3 + -1;
        } while (uVar8 < uVar13);
      }
      uVar17 = local_48;
      uVar19 = uVar19 - 1;
      iVar11 = iVar11 + -1;
    } while ((int)uVar19 != 0);
    if (local_9c != 0) {
      uVar19 = 1;
      uVar16 = 0;
      do {
        uVar8 = local_d8[uVar16];
        uVar13 = local_98[uVar16];
        uVar20 = uVar19;
        if (uVar8 != uVar13) {
          do {
            if (uVar9 <= uVar20) break;
            uVar14 = local_d8[uVar20];
            iVar11 = IntervalMapDetails::
                     NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Compilation::NetAlias_*,_8U>
                     ::adjustFromLeftSib((NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Compilation::NetAlias_*,_8U>
                                          *)local_68[uVar20],uVar14,
                                         (NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Compilation::NetAlias_*,_8U>
                                          *)local_68[uVar16],uVar8,uVar8 - uVar13);
            local_d8[uVar20] = uVar14 + iVar11;
            uVar8 = local_d8[uVar16] - iVar11;
            local_d8[uVar16] = uVar8;
            uVar13 = local_98[uVar16];
            uVar20 = uVar20 + 1;
          } while (uVar8 < uVar13);
        }
        uVar16 = uVar16 + 1;
        uVar19 = uVar19 + 1;
      } while (uVar16 != uVar17);
    }
  }
  uVar19 = local_80;
  if (local_c0.value != 0) {
    IntervalMapDetails::Path::moveLeft((Path *)local_b8,(uint32_t)local_80);
  }
  uVar20 = local_a8 & 0xffffffff;
  uVar16 = (ulong)local_b0 & 0xffffffff;
  local_c0.value = 0;
  uVar17 = 0;
  while( true ) {
    uVar14 = (uint32_t)uVar19;
    if (uVar17 == uVar20 && (int)local_a8 != 0) {
      puVar2 = (unsigned_long *)local_68[uVar20];
      uVar8 = local_98[uVar20];
      local_40.right = puVar2[1];
      if (1 < (ulong)uVar8) {
        lVar18 = 0;
        do {
          uVar19 = *(ulong *)((long)puVar2 + lVar18 + 0x18);
          if (local_40.right <= uVar19) {
            local_40.right = uVar19;
          }
          lVar18 = lVar18 + 0x10;
        } while ((ulong)uVar8 * 0x10 + -0x10 != lVar18);
      }
      local_40.left = *puVar2;
      bVar4 = IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::iterator::
              insertNode((iterator *)local_70,uVar14,
                         (NodeRef)((ulong)puVar2 & 0xffffffffffffffc0 | (ulong)(uVar8 - 1)),
                         &local_40,local_78);
      local_c0.value = CONCAT71(extraout_var,bVar4);
      uVar19 = (ulong)(uVar14 + bVar4);
    }
    else {
      uVar15 = local_98[uVar17];
      lVar18 = *(long *)local_b8;
      *(uint32_t *)(lVar18 + 8 + (uVar19 & 0xffffffff) * 0x10) = uVar15;
      if (uVar14 != 0) {
        lVar10 = (ulong)(uVar14 - 1) * 0x10;
        uVar12 = (ulong)*(uint *)(lVar18 + 0xc + lVar10);
        lVar18 = *(long *)(lVar18 + lVar10);
        *(ulong *)(lVar18 + uVar12 * 8) =
             *(ulong *)(lVar18 + uVar12 * 8) & 0xffffffffffffffc0 | (ulong)(uVar15 - 1);
      }
      IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::iterator::
      recomputeBounds((iterator *)local_70,uVar14);
    }
    piVar1 = local_b8;
    if (uVar17 + 1 == (ulong)uVar9) break;
    IntervalMapDetails::Path::moveRight((Path *)local_b8,(uint32_t)uVar19);
    uVar16 = (ulong)((int)uVar16 - 1);
    uVar17 = uVar17 + 1;
  }
  if ((uint)uVar17 != local_b0.first) {
    do {
      IntervalMapDetails::Path::moveLeft((Path *)piVar1,(uint32_t)uVar19);
      uVar9 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar9;
    } while (uVar9 != 0);
  }
  *(uint *)(*(long *)piVar1 + 0xc + (uVar19 & 0xffffffff) * 0x10) = local_b0.second;
  return (bool)((byte)local_c0.value & 1);
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::overflow(uint32_t level, allocator_type& alloc) {
    SLANG_ASSERT(level > 0);
    using namespace IntervalMapDetails;

    auto& path = this->path;
    uint32_t offset = path.offset(level);
    uint32_t numElems = 0;
    uint32_t numNodes = 0;
    TNode* nodes[4];
    uint32_t curSizes[4];

    // Handle left sibling, if it exists.
    NodeRef leftSib = path.getLeftSibling(level);
    if (leftSib) {
        numElems = curSizes[0] = leftSib.size();
        offset += numElems;
        nodes[numNodes++] = &leftSib.get<TNode>();
    }

    // Handle the current node.
    numElems += curSizes[numNodes] = path.size(level);
    nodes[numNodes++] = &path.template node<TNode>(level);

    // Handle right sibling, if it exists.
    NodeRef rightSib = path.getRightSibling(level);
    if (rightSib) {
        numElems += curSizes[numNodes] = rightSib.size();
        nodes[numNodes++] = &rightSib.get<TNode>();
    }

    // Check if we need to allocate a new node.
    uint32_t newNode = 0;
    if (numElems + 1 > numNodes * TNode::Capacity) {
        // Insert new node at the penultimate position, or after a single node if only one.
        newNode = numNodes == 1 ? 1 : numNodes - 1;
        curSizes[numNodes] = curSizes[newNode];
        nodes[numNodes] = nodes[newNode];
        curSizes[newNode] = 0;
        nodes[newNode] = alloc.template emplace<TNode>();
        numNodes++;
    }

    // Redistribute elements among the nodes.
    uint32_t newSizes[4];
    IndexPair newOffset = distribute(numNodes, numElems, TNode::Capacity, newSizes, offset);

    // Move elements right.
    for (uint32_t n = numNodes - 1; n; --n) {
        if (curSizes[n] == newSizes[n])
            continue;

        for (int m = int(n - 1); m != -1; --m) {
            int delta = nodes[n]->adjustFromLeftSib(curSizes[n], *nodes[m], curSizes[m],
                                                    int(newSizes[n]) - int(curSizes[n]));
            curSizes[m] = uint32_t(int(curSizes[m]) - delta);
            curSizes[n] = uint32_t(int(curSizes[n]) + delta);

            // If the current node was exhausted we can bail out.
            if (curSizes[n] >= newSizes[n])
                break;
        }
    }

    // Move elements left.
    for (uint32_t n = 0; n < numNodes - 1; n++) {
        if (curSizes[n] == newSizes[n])
            continue;

        for (uint32_t m = n + 1; m < numNodes; m++) {
            int delta = nodes[m]->adjustFromLeftSib(curSizes[m], *nodes[n], curSizes[n],
                                                    int(curSizes[n]) - int(newSizes[n]));
            curSizes[m] = uint32_t(int(curSizes[m]) + delta);
            curSizes[n] = uint32_t(int(curSizes[n]) - delta);

            // If the current node was exhausted we can bail out.
            if (curSizes[n] >= newSizes[n])
                break;
        }
    }

    // Move the path to the leftmost node.
    if (leftSib)
        path.moveLeft(level);

    // Elements have been moved, update node sizes and interval bounds.
    bool split = false;
    uint32_t pos = 0;
    while (true) {
        if (newNode && pos == newNode) {
            // Actually insert the new node that we created earlier.
            auto ival = nodes[pos]->getBounds(newSizes[pos]);
            split = insertNode(level, NodeRef(nodes[pos], newSizes[pos]), ival, alloc);
            if (split)
                level++;
        }
        else {
            // Otherwise just update the size and bounds.
            path.setSize(level, newSizes[pos]);
            recomputeBounds(level);
        }

        if (pos + 1 == numNodes)
            break;

        path.moveRight(level);
        ++pos;
    }

    // Move our path to the new offset of the element we used to be pointing at.
    while (pos != newOffset.first) {
        path.moveLeft(level);
        --pos;
    }

    path.offset(level) = newOffset.second;
    return split;
}